

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManSetMark1Dfs_rec(Gia_Man_t *p,int iObj)

{
  ulong uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  
  while( true ) {
    pGVar3 = Gia_ManObj(p,iObj);
    uVar1 = *(ulong *)pGVar3;
    if ((uVar1 & 0x4000000000000000) != 0) {
      return;
    }
    *(ulong *)pGVar3 = uVar1 | 0x4000000000000000;
    uVar2 = (uint)uVar1;
    if ((int)uVar2 < 0) break;
    if ((uVar2 & 0x1fffffff) == 0x1fffffff) {
      return;
    }
    Gia_ManSetMark1Dfs_rec(p,iObj - (uVar2 & 0x1fffffff));
    iObj = iObj - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff);
  }
  return;
}

Assistant:

void Gia_ManSetMark1Dfs_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    pObj = Gia_ManObj( p, iObj );
    if ( pObj->fMark1 )
        return;
    pObj->fMark1 = 1;
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Gia_ManSetMark1Dfs_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Gia_ManSetMark1Dfs_rec( p, Gia_ObjFaninId1(pObj, iObj) );
}